

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O2

void __thiscall GoState<3U,_4U>::GoState(GoState<3U,_4U> *this,char (*board) [5])

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  int j;
  ulong uVar3;
  int i;
  ulong uVar4;
  GoState<3U,_4U> state;
  
  this->_vptr_GoState = (_func_int **)&PTR__GoState_00163950;
  this->previous_board_hash_value = 0;
  p_Var1 = &(this->all_hash_values)._M_t._M_impl.super__Rb_tree_header;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->depth = 0;
  this->player_to_move = 1;
  GoState(&state);
  for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
    for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
      bVar2 = ((*board)[uVar3] == '2') * '\x02';
      if ((*board)[uVar3] == '1') {
        bVar2 = 1;
      }
      (*this->_vptr_GoState[3])(this,uVar4 & 0xffffffff,uVar3 & 0xffffffff,(ulong)bVar2);
    }
    board = board + 1;
  }
  ~GoState(&state);
  return;
}

Assistant:

GoState(char board[M][N+1]):
		previous_board_hash_value(0),
		depth(0),
		player_to_move(1)
	{
		GoState<M, N> state;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == '1') {
				set_pos(i, j, 1);
			}
			else if (board[i][j] == '2') {
				set_pos(i, j, 2);
			}
			else {
				set_pos(i, j, empty);
			}
		}}
	}